

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proj.c
# Opt level: O2

void project_normalcone(OSQPWorkspace *work,c_float *z,c_float *y)

{
  OSQPData *pOVar1;
  c_float *pcVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  pOVar1 = work->data;
  lVar4 = 0;
  lVar3 = pOVar1->m;
  if (pOVar1->m < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    dVar5 = z[lVar4] + y[lVar4];
    pcVar2 = work->z_prev;
    pcVar2[lVar4] = dVar5;
    if (dVar5 <= pOVar1->l[lVar4]) {
      dVar5 = pOVar1->l[lVar4];
    }
    if (pOVar1->u[lVar4] <= dVar5) {
      dVar5 = pOVar1->u[lVar4];
    }
    z[lVar4] = dVar5;
    y[lVar4] = pcVar2[lVar4] - dVar5;
  }
  return;
}

Assistant:

void project_normalcone(OSQPWorkspace *work, c_float *z, c_float *y) {
  c_int i, m;

  // NB: Use z_prev as temporary vector

  m = work->data->m;

  for (i = 0; i < m; i++) {
    work->z_prev[i] = z[i] + y[i];
    z[i]            = c_min(c_max(work->z_prev[i], work->data->l[i]),
                            work->data->u[i]);
    y[i] = work->z_prev[i] - z[i];
  }
}